

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_fputcsv(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_user_func *pjVar1;
  long *plVar2;
  undefined8 *puVar3;
  jx9_value *pjVar4;
  char *pcVar5;
  jx9_vm *pVm;
  int n;
  csv_data sCsv;
  int local_3c;
  undefined8 local_38;
  long *local_30;
  undefined4 local_28;
  
  if (((nArg < 2) || (((*apArg)->iFlags & 0x100) == 0)) ||
     (pjVar4 = apArg[1], (pjVar4->iFlags & 0x40) == 0)) {
    pjVar1 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar5 = "Missing/Invalid arguments";
  }
  else {
    plVar2 = (long *)((*apArg)->x).pOther;
    if ((plVar2 != (long *)0x0) && (*(int *)((long)plVar2 + 0x34) == 0xfeac14)) {
      puVar3 = (undefined8 *)*plVar2;
      if (puVar3 == (undefined8 *)0x0) {
        pcVar5 = "null_stream";
      }
      else {
        if (puVar3[8] != 0) {
          local_38 = 0x220000002c;
          local_28 = 0;
          local_30 = plVar2;
          if (nArg != 2) {
            pcVar5 = jx9_value_to_string(apArg[2],&local_3c);
            if (0 < local_3c) {
              local_38 = CONCAT44(local_38._4_4_,(int)*pcVar5);
            }
            if ((3 < (uint)nArg) && (pcVar5 = jx9_value_to_string(apArg[3],&local_3c), 0 < local_3c)
               ) {
              local_38 = CONCAT44((int)*pcVar5,(undefined4)local_38);
            }
            pjVar4 = apArg[1];
            if ((pjVar4->iFlags & 0x40) == 0) goto LAB_0013e732;
          }
          jx9HashmapWalk((jx9_hashmap *)(pjVar4->x).pOther,csv_write_callback,&local_38);
LAB_0013e732:
          (**(code **)(*plVar2 + 0x40))(plVar2[1],"\n",1);
          return 0;
        }
        pcVar5 = (char *)*puVar3;
      }
      jx9_context_throw_error_format
                (pCtx,2,
                 "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
                 ,(pCtx->pFunc->sName).zString,pcVar5);
      goto LAB_0013e653;
    }
    pjVar1 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar5 = "Expecting an IO handle";
  }
  jx9VmThrowError(pVm,&pjVar1->sName,2,pcVar5);
LAB_0013e653:
  pjVar4 = pCtx->pRet;
  jx9MemObjRelease(pjVar4);
  (pjVar4->x).rVal = 0.0;
  pjVar4->iFlags = pjVar4->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_fputcsv(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	struct csv_data sCsv;
	io_private *pDev;
	char *zEol;
	int eolen;
	if( nArg < 2 || !jx9_value_is_resource(apArg[0]) || !jx9_value_is_json_array(apArg[1]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Missing/Invalid arguments");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  || pStream->xWrite == 0){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Set default csv separator */
	sCsv.delimiter = ',';
	sCsv.enclosure = '"';
	sCsv.pDev = pDev;
	sCsv.iCount = 0;
	if( nArg > 2 ){
		/* User delimiter */
		const char *z;
		int n;
		z = jx9_value_to_string(apArg[2], &n);
		if( n > 0 ){
			sCsv.delimiter = z[0];
		}
		if( nArg > 3 ){
			z = jx9_value_to_string(apArg[3], &n);
			if( n > 0 ){
				sCsv.enclosure = z[0];
			}
		}
	}
	/* Iterate throw array entries and write csv data */
	jx9_array_walk(apArg[1], csv_write_callback, &sCsv);
	/* Write a line ending */
#ifdef __WINNT__
	zEol = "\r\n";
	eolen = (int)sizeof("\r\n")-1;
#else
	/* Assume UNIX LF */
	zEol = "\n";
	eolen = (int)sizeof(char);
#endif
	pDev->pStream->xWrite(pDev->pHandle, (const void *)zEol, eolen);
	return JX9_OK;
}